

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O1

longlong __thiscall MinVR::VRDataQueue::makeTimeStamp(VRDataQueue *this)

{
  timeval tp;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  return local_18.tv_sec * 1000000 + local_18.tv_usec;
}

Assistant:

long long VRDataQueue::makeTimeStamp() {

#ifdef WIN32
	LARGE_INTEGER t1;

	FILETIME ft;

	// Determine if windows 8 or greater
	OSVERSIONINFO osvi;
	ZeroMemory(&osvi, sizeof(OSVERSIONINFO));
	osvi.dwOSVersionInfoSize = sizeof(OSVERSIONINFO);
	GetVersionEx(&osvi);

	//https://en.wikipedia.org/wiki/List_of_Microsoft_Windows_versions
	if (osvi.dwMajorVersion > 6 || (osvi.dwMajorVersion == 6) && (osvi.dwMinorVersion >= 2)) {
		GetSystemTimePreciseAsFileTime(&ft); // Requires windows 8 and above. Should give microsecond resolution and be consistent across different machines if they are using a time server.
	}
	else {
		GetSystemTimeAsFileTime(&ft);
	}

	
	t1.LowPart = ft.dwLowDateTime;
	t1.HighPart = ft.dwHighDateTime;

	long long timeStamp = t1.QuadPart;
#else

  struct timeval tp;
  gettimeofday(&tp, NULL);

  // Get current timestamp in milliseconds.
  long long timeStamp = (long long) tp.tv_sec * 1000000L + tp.tv_usec;

#endif

  return timeStamp;
}